

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O1

Iterator __thiscall
axl::sl::
HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*,_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_axl::io::NetworkAdapterDesc_*>
::visit(HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*,_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_axl::io::NetworkAdapterDesc_*>
        *this,StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *key)

{
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>_>_>
  *this_00;
  size_t *psVar1;
  Bucket *pBVar2;
  C *__s1;
  size_t __n;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>
  IVar6;
  HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
  *pHVar7;
  ListLink *pLVar8;
  byte *pbVar9;
  EVP_PKEY_CTX *src;
  ListLink *link;
  ulong uVar10;
  AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>
  *pAVar11;
  size_t sVar12;
  
  this_00 = &this->m_table;
  sVar12 = (this->m_table).
           super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>_>_>
           .m_count;
  if (sVar12 == 0) {
    sVar12 = 0x20;
    bVar3 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::io::NetworkAdapterDesc*>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::io::NetworkAdapterDesc*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::io::NetworkAdapterDesc*>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::io::NetworkAdapterDesc*>::GetBucketLink>>>
            ::
            setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::io::NetworkAdapterDesc*>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::io::NetworkAdapterDesc*>::GetBucketLink>>::Construct>
                      ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::io::NetworkAdapterDesc*>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::io::NetworkAdapterDesc*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::io::NetworkAdapterDesc*>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,axl::io::NetworkAdapterDesc*>::GetBucketLink>>>
                        *)this_00,0x20);
    if (!bVar3) {
      return (Iterator)(Entry *)0x0;
    }
  }
  if ((long)key->m_length < 1) {
    uVar10 = 0x1505;
  }
  else {
    pbVar9 = (byte *)key->m_p;
    pbVar5 = pbVar9 + key->m_length;
    uVar10 = 0x1505;
    do {
      uVar10 = (ulong)*pbVar9 + uVar10 * 0x21;
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 < pbVar5);
  }
  bVar3 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>_>_>
          ::ensureExclusive(this_00);
  pAVar11 = (AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>
             *)0x0;
  if (bVar3) {
    pAVar11 = (this_00->
              super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>_>_>
              ).m_p;
  }
  IVar6.m_p = pAVar11[uVar10 % sVar12].
              super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>_>
              .
              super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>
              .m_head;
  if (IVar6.m_p != (Entry *)0x0) {
    __s1 = key->m_p;
    __n = key->m_length;
    do {
      if ((__n == ((IVar6.m_p)->
                  super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
                  ).m_key.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length) &&
         (iVar4 = bcmp(__s1,((IVar6.m_p)->
                            super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
                            ).m_key.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p
                       ,__n), iVar4 == 0)) {
        return (Iterator)IVar6.m_p;
      }
      pLVar8 = ((IVar6.m_p)->m_bucketLink).m_next;
      IVar6.m_p = (Entry *)&pLVar8[-4].m_prev;
    } while (pLVar8 != (ListLink *)0x0);
  }
  pBVar2 = pAVar11 + uVar10 % sVar12;
  IVar6.m_p = (Entry *)operator_new(0x50);
  ((IVar6.m_p)->
  super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
  ).super_ListLink.m_next = (ListLink *)0x0;
  ((IVar6.m_p)->
  super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
  ).super_ListLink.m_prev = (ListLink *)0x0;
  ((IVar6.m_p)->
  super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
  ).m_key.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
  ((IVar6.m_p)->
  super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
  ).m_key.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr = (BufHdr *)0x0;
  ((IVar6.m_p)->
  super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
  ).m_key.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length = 0;
  *(undefined8 *)
   &((IVar6.m_p)->
    super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
    ).m_key.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_isNullTerminated = 0;
  ((IVar6.m_p)->
  super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
  ).m_value = (NetworkAdapterDesc *)0x0;
  ((IVar6.m_p)->m_bucketLink).m_next = (ListLink *)0x0;
  ((IVar6.m_p)->m_bucketLink).m_prev = (ListLink *)0x0;
  (IVar6.m_p)->m_bucket = (Bucket *)0x0;
  StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
            (&((IVar6.m_p)->
              super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
              ).m_key,(EVP_PKEY_CTX *)key,src);
  (IVar6.m_p)->m_bucket = pBVar2;
  pHVar7 = (this->m_list).
           super_OwningListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>_>
           .
           super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>_>
           .
           super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>
           .m_tail;
  ((IVar6.m_p)->
  super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
  ).super_ListLink.m_next = (ListLink *)0x0;
  ((IVar6.m_p)->
  super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
  ).super_ListLink.m_prev = (ListLink *)pHVar7;
  if (pHVar7 == (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
                 *)0x0) {
    pHVar7 = (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
              *)this;
  }
  (((OwningListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>_>
     *)&(pHVar7->
        super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
        ).super_ListLink)->
  super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>_>
  ).
  super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>
  .m_head = IVar6.m_p;
  (this->m_list).
  super_OwningListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>_>
  .
  super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>_>
  .
  super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>
  .m_tail = IVar6.m_p;
  psVar1 = &(this->m_list).
            super_OwningListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>_>
            .
            super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>_>
            .
            super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>
            .m_count;
  *psVar1 = *psVar1 + 1;
  pHVar7 = (pBVar2->
           super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>_>
           ).
           super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>
           .m_tail;
  pLVar8 = &pHVar7->m_bucketLink;
  if (pHVar7 == (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
                 *)0x0) {
    pLVar8 = (ListLink *)0x0;
  }
  ((IVar6.m_p)->m_bucketLink).m_next = (ListLink *)0x0;
  ((IVar6.m_p)->m_bucketLink).m_prev = pLVar8;
  if (pHVar7 == (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>
                 *)0x0) {
    (pBVar2->
    super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>_>
    ).
    super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>
    .m_head = IVar6.m_p;
  }
  else {
    pLVar8->m_next = &(IVar6.m_p)->m_bucketLink;
  }
  (pBVar2->
  super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>_>
  ).
  super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>
  .m_tail = IVar6.m_p;
  psVar1 = &(pBVar2->
            super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>::GetBucketLink>_>
            ).
            super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>
            .m_count;
  *psVar1 = *psVar1 + 1;
  if (this->m_resizeThreshold <
      ((this->m_list).
       super_OwningListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>_>
       .
       super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>,_axl::sl::ListLink>_>_>
       .
       super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::io::NetworkAdapterDesc_*>_>
       .m_count * 100) / sVar12) {
    setBucketCount(this,sVar12 * 2);
  }
  return (Iterator)IVar6.m_p;
}

Assistant:

Iterator
	visit(KeyArg key) {
		size_t bucketCount = m_table.getCount();
		if (!bucketCount) {
			bucketCount = Def_InitialBucketCount;

			bool result = m_table.setCount(bucketCount);
			if (!result)
				return NULL;
		}

		size_t hash = m_hash(key);
		Bucket* bucket = &m_table.rwi()[hash % bucketCount];
		typename Bucket::Iterator it = bucket->getHead();
		for (; it; it++) {
			bool isEqual = m_eq(key, it->m_key);
			if (isEqual)
				return it;
		}

		Entry* entry = new (mem::ZeroInit) Entry;
		entry->m_key = key;
		entry->m_bucket = bucket;
		m_list.insertTail(entry);
		bucket->insertTail(entry);

	#if (AXL_PTR_BITS == 64)
		size_t loadFactor = getCount() * 100 / bucketCount;
	#else
		size_t loadFactor = (size_t)((uint64_t)getCount() * 100 / bucketCount);
	#endif

		if (loadFactor > m_resizeThreshold)
			setBucketCount(bucketCount * 2);

		return entry;
	}